

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void tcg_gen_gvec_xori_ppc64
               (TCGContext_conflict10 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,int64_t c,
               uint32_t oprsz,uint32_t maxsz)

{
  uint64_t val;
  TCGv_i64 c_00;
  TCGv_i64 tmp;
  uint32_t oprsz_local;
  int64_t c_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  uint vece_local;
  TCGContext_conflict10 *tcg_ctx_local;
  
  val = dup_const_func_ppc64(vece,c);
  c_00 = tcg_const_i64_ppc64(tcg_ctx,val);
  tcg_gen_gvec_2s_ppc64(tcg_ctx,dofs,aofs,oprsz,maxsz,c_00,&gop_xors);
  tcg_temp_free_i64(tcg_ctx,c_00);
  return;
}

Assistant:

void tcg_gen_gvec_xori(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                       int64_t c, uint32_t oprsz, uint32_t maxsz)
{
    TCGv_i64 tmp = tcg_const_i64(tcg_ctx, dup_const(vece, c));
    tcg_gen_gvec_2s(tcg_ctx, dofs, aofs, oprsz, maxsz, tmp, &gop_xors);
    tcg_temp_free_i64(tcg_ctx, tmp);
}